

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

reference __thiscall
QVLABase<QByteArrayView>::emplace_back_impl<QByteArrayView>
          (QVLABase<QByteArrayView> *this,qsizetype prealloc,void *array,QByteArrayView *args)

{
  QVLABase<QByteArrayView> *this_00;
  QVLABase<QByteArrayView> *pQVar1;
  iterator ptr;
  QByteArrayView *pQVar2;
  QByteArrayView *in_RCX;
  void *in_RDX;
  qsizetype in_RSI;
  QVLABaseBase *in_RDI;
  reference r;
  QVLABaseBase *this_01;
  
  this_01 = in_RDI;
  this_00 = (QVLABase<QByteArrayView> *)QVLABaseBase::size(in_RDI);
  pQVar1 = (QVLABase<QByteArrayView> *)QVLABaseBase::capacity(in_RDI);
  if (this_00 == pQVar1) {
    growBy((QVLABase<QByteArrayView> *)this_01,in_RSI,in_RDX,(qsizetype)in_RCX);
  }
  ptr = end(this_00);
  pQVar2 = q20::construct_at<QByteArrayView,QByteArrayView,void>(ptr,in_RCX);
  in_RDI->s = in_RDI->s + 1;
  return pQVar2;
}

Assistant:

reference emplace_back_impl(qsizetype prealloc, void *array, Args&&...args)
    {
        if (size() == capacity()) // ie. size() != 0
            growBy(prealloc, array, 1);
        reference r = *q20::construct_at(end(), std::forward<Args>(args)...);
        ++s;
        return r;
    }